

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall cmake::RunCheckForUnusedVariables(cmake *this)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  bool bVar3;
  cmListFileBacktrace cStack_1e8;
  string local_1c8;
  ostringstream msg;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
  std::operator<<((ostream *)&msg,"Manually-specified variables were not used by the project:");
  bVar3 = false;
  for (p_Var2 = (this->UsedCliVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->UsedCliVariables)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    if ((char)p_Var2[2]._M_color == _S_red) {
      poVar1 = std::operator<<((ostream *)&msg,"\n  ");
      bVar3 = true;
      std::operator<<(poVar1,(string *)(p_Var2 + 1));
    }
  }
  if (bVar3) {
    std::__cxx11::stringbuf::str();
    cmListFileBacktrace::cmListFileBacktrace(&cStack_1e8);
    IssueMessage(this,WARNING,&local_1c8,&cStack_1e8);
    cmListFileBacktrace::~cmListFileBacktrace(&cStack_1e8);
    std::__cxx11::string::~string((string *)&local_1c8);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
  return;
}

Assistant:

void cmake::RunCheckForUnusedVariables()
{
#ifdef CMAKE_BUILD_WITH_CMAKE
  bool haveUnused = false;
  std::ostringstream msg;
  msg << "Manually-specified variables were not used by the project:";
  for (std::map<std::string, bool>::const_iterator it =
         this->UsedCliVariables.begin();
       it != this->UsedCliVariables.end(); ++it) {
    if (!it->second) {
      haveUnused = true;
      msg << "\n  " << it->first;
    }
  }
  if (haveUnused) {
    this->IssueMessage(cmake::WARNING, msg.str());
  }
#endif
}